

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_value * GenStateNewStrObj(jx9_gen_state *pGen,sxi32 *pCount)

{
  sxu32 local_2c;
  jx9_gen_state *pjStack_28;
  sxu32 nIdx;
  jx9_value *pConstObj;
  sxi32 *pCount_local;
  jx9_gen_state *pGen_local;
  
  local_2c = 0;
  pConstObj = (jx9_value *)pCount;
  pCount_local = (sxi32 *)pGen;
  pjStack_28 = (jx9_gen_state *)jx9VmReserveConstObj(pGen->pVm,&local_2c);
  if (pjStack_28 == (jx9_gen_state *)0x0) {
    GenStateOutOfMem((jx9_gen_state *)pCount_local);
    pGen_local = (jx9_gen_state *)0x0;
  }
  else {
    *(int *)&pConstObj->x = *(int *)&pConstObj->x + 1;
    jx9MemObjInitFromString(*(jx9_vm **)pCount_local,(jx9_value *)pjStack_28,(SyString *)0x0);
    jx9VmEmitInstr(*(jx9_vm **)pCount_local,4,0,local_2c,(void *)0x0,(sxu32 *)0x0);
    pGen_local = pjStack_28;
  }
  return (jx9_value *)pGen_local;
}

Assistant:

static jx9_value * GenStateNewStrObj(jx9_gen_state *pGen,sxi32 *pCount)
{
	jx9_value *pConstObj;
	sxu32 nIdx = 0;
	/* Reserve a new constant */
	pConstObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
	if( pConstObj == 0 ){
		GenStateOutOfMem(&(*pGen));
		return 0;
	}
	(*pCount)++;
	jx9MemObjInitFromString(pGen->pVm, pConstObj, 0);
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	return pConstObj;
}